

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3PagerUnrefNotNull(DbPage *pPg)

{
  Pager *pPager_00;
  Pager *pPager;
  
  pPager_00 = pPg->pPager;
  if ((pPg->flags & 0x20) == 0) {
    sqlite3PcacheRelease(pPg);
  }
  else {
    pPager_00->nMmapOut = pPager_00->nMmapOut + -1;
    pPg->pDirty = pPager_00->pMmapFreelist;
    pPager_00->pMmapFreelist = pPg;
    (*pPager_00->fd->pMethods->xUnfetch)
              (pPager_00->fd,(long)pPager_00->pageSize * (ulong)(pPg->pgno - 1),pPg->pData);
  }
  pagerUnlockIfUnused(pPager_00);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PagerUnrefNotNull(DbPage *pPg){
  Pager *pPager;
  assert( pPg!=0 );
  pPager = pPg->pPager;
  if( pPg->flags & PGHDR_MMAP ){
    pagerReleaseMapPage(pPg);
  }else{
    sqlite3PcacheRelease(pPg);
  }
  pagerUnlockIfUnused(pPager);
}